

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_wrap.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Thread *this;
  int local_3c;
  duration<long,_std::ratio<1L,_1L>_> local_38 [3];
  Thread *local_20;
  Thread *t;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  t = (Thread *)argv;
  argv_local._0_4_ = argc;
  this = (Thread *)operator_new(0x18);
  this->_vptr_Thread = (_func_int **)0x0;
  *(undefined8 *)&this->_stop = 0;
  (this->_thread)._M_id._M_thread = 0;
  DerivedThread::DerivedThread((DerivedThread *)this);
  local_20 = this;
  Thread::start(this);
  local_3c = 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)local_38,&local_3c);
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>(local_38);
  Thread::join(local_20);
  if (local_20 != (Thread *)0x0) {
    (*local_20->_vptr_Thread[1])();
  }
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	Thread* t = new DerivedThread();
	t->start();
	std::this_thread::sleep_for(std::chrono::seconds(1));
	t->join();
	delete t;

	return 0;
}